

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcConversionBasedUnit_0088f4d0;
  *(undefined ***)&this->field_0x70 = &PTR__IfcConversionBasedUnit_0088f520;
  *(undefined ***)&(this->super_IfcNamedUnit).field_0x38 = &PTR__IfcConversionBasedUnit_0088f4f8;
  puVar1 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48;
  if (puVar1 != &this->field_0x58) {
    operator_delete(puVar1,*(long *)&this->field_0x58 + 1);
  }
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x88f548;
  *(undefined8 *)&this->field_0x70 = 0x88f570;
  puVar2 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x18;
  puVar1 = &(this->super_IfcNamedUnit).field_0x28;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x88);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}